

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6392::FloatxNanInfTest_DIV_3_3_simple_inf_Test::
~FloatxNanInfTest_DIV_3_3_simple_inf_Test(FloatxNanInfTest_DIV_3_3_simple_inf_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_3_3_simple_inf)
{
    using T = flexfloat<3, 3>;
    T a = 0.33333333333333331483;
    T b =
        (0.03125000000000000000 / 2 -
         1e-7);  // a bit smaller than half of the smallest subnormal in <3,3>
    T c = 0;
    c = a / b;

    // printf("a: 			"); show((fp_t)a);
    // printf("b: 			"); show((fp_t)b);
    // printf("c:   		"); show((fp_t)c);
    // printf("inf: 		"); show((fp_t)inf);

    EXPECT_EQ(fp_t(a), 3.43750000000000000000e-01);
    EXPECT_EQ(fp_t(b), 00000000000000000000);
    EXPECT_EQ(fp_t(c), inf);
}